

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcStatesStates
          (BeagleCPU4StateImpl<double,_1,_0> *this,double *destP,int *states1,double *matrices1,
          int *states2,double *matrices2,int startPattern,int endPattern)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  double *pdVar7;
  int iVar8;
  int local_4c;
  
  iVar1 = (this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
  if (0 < iVar1) {
    iVar2 = (this->super_BeagleCPUImpl<double,_1,_0>).kPaddedPatternCount;
    iVar8 = 0;
    local_4c = startPattern * 4;
    do {
      if (startPattern < endPattern) {
        iVar5 = iVar8 * 0x14;
        pdVar7 = destP + (long)local_4c + 3;
        lVar6 = (long)startPattern;
        do {
          iVar3 = states1[lVar6];
          iVar4 = states2[lVar6];
          lVar6 = lVar6 + 1;
          pdVar7[-3] = matrices1[iVar3 + iVar5] * matrices2[iVar4 + iVar5];
          pdVar7[-2] = matrices1[iVar3 + iVar5 + 5] * matrices2[iVar4 + iVar5 + 5];
          pdVar7[-1] = matrices1[iVar3 + iVar5 + 10] * matrices2[iVar4 + iVar5 + 10];
          *pdVar7 = matrices1[iVar3 + iVar5 + 0xf] * matrices2[iVar4 + iVar5 + 0xf];
          pdVar7 = pdVar7 + 4;
        } while (endPattern != lVar6);
      }
      iVar8 = iVar8 + 1;
      local_4c = local_4c + iVar2 * 4;
    } while (iVar8 != iVar1);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcStatesStates(REALTYPE* destP,
                                                               const int* states1,
                                                               const REALTYPE* matrices1,
                                                               const int* states2,
                                                               const REALTYPE* matrices2,
                                                               int startPattern,
                                                               int endPattern) {

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*4*kPaddedPatternCount;
        if (startPattern != 0) {
          v += 4*startPattern;
        }

        int w = l*4*OFFSET;

        for (int k = startPattern; k < endPattern; k++) {

            const int state1 = states1[k];
            const int state2 = states2[k];

            destP[v    ] = matrices1[w            + state1] *
                           matrices2[w            + state2];
            destP[v + 1] = matrices1[w + OFFSET*1 + state1] *
                           matrices2[w + OFFSET*1 + state2];
            destP[v + 2] = matrices1[w + OFFSET*2 + state1] *
                           matrices2[w + OFFSET*2 + state2];
            destP[v + 3] = matrices1[w + OFFSET*3 + state1] *
                           matrices2[w + OFFSET*3 + state2];
           v += 4;
        }
    }
}